

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O0

bool __thiscall
duckdb_shell::ShellState::SetOutputMode(ShellState *this,char *mode_str,char *tbl_name)

{
  char cVar1;
  int iVar2;
  char *zName;
  ShellState *in_RDX;
  char *in_RSI;
  long in_RDI;
  char c2;
  idx_t n2;
  
  zName = (char *)StringLength((char *)0x1ddf67);
  cVar1 = *in_RSI;
  if (((cVar1 == 'l') && ((char *)0x2 < zName)) &&
     (iVar2 = strncmp(in_RSI,"lines",(size_t)zName), iVar2 == 0)) {
    *(undefined4 *)(in_RDI + 0x2c) = 0;
    std::__cxx11::string::operator=((string *)(in_RDI + 0x80),anon_var_dwarf_3e83f70 + 8);
  }
  else if ((cVar1 == 'c') && (iVar2 = strncmp(in_RSI,"columns",(size_t)zName), iVar2 == 0)) {
    *(undefined4 *)(in_RDI + 0x2c) = 1;
    if ((*(uint *)(in_RDI + 0x40) & 0x80) == 0) {
      *(undefined1 *)(in_RDI + 0x3c) = 1;
    }
    std::__cxx11::string::operator=((string *)(in_RDI + 0x80),anon_var_dwarf_3e83f70 + 8);
  }
  else if ((cVar1 == 'l') &&
          (((char *)0x2 < zName && (iVar2 = strncmp(in_RSI,"list",(size_t)zName), iVar2 == 0)))) {
    *(undefined4 *)(in_RDI + 0x2c) = 2;
    std::__cxx11::string::operator=((string *)(in_RDI + 0x60),"|");
    std::__cxx11::string::operator=((string *)(in_RDI + 0x80),anon_var_dwarf_3e83f70 + 8);
  }
  else if ((cVar1 == 'h') && (iVar2 = strncmp(in_RSI,"html",(size_t)zName), iVar2 == 0)) {
    *(undefined4 *)(in_RDI + 0x2c) = 4;
  }
  else if ((cVar1 == 't') && (iVar2 = strncmp(in_RSI,"tcl",(size_t)zName), iVar2 == 0)) {
    *(undefined4 *)(in_RDI + 0x2c) = 7;
    std::__cxx11::string::operator=((string *)(in_RDI + 0x60)," ");
    std::__cxx11::string::operator=((string *)(in_RDI + 0x80),anon_var_dwarf_3e83f70 + 8);
  }
  else if ((cVar1 == 'c') && (iVar2 = strncmp(in_RSI,"csv",(size_t)zName), iVar2 == 0)) {
    *(undefined4 *)(in_RDI + 0x2c) = 8;
    std::__cxx11::string::operator=((string *)(in_RDI + 0x60),",");
    std::__cxx11::string::operator=((string *)(in_RDI + 0x80),"\r\n");
  }
  else if ((cVar1 == 't') && (iVar2 = strncmp(in_RSI,"tabs",(size_t)zName), iVar2 == 0)) {
    *(undefined4 *)(in_RDI + 0x2c) = 2;
    std::__cxx11::string::operator=((string *)(in_RDI + 0x60),anon_var_dwarf_3e84351 + 7);
  }
  else if ((cVar1 == 'i') && (iVar2 = strncmp(in_RSI,"insert",(size_t)zName), iVar2 == 0)) {
    *(undefined4 *)(in_RDI + 0x2c) = 5;
    SetTableName(in_RDX,zName);
  }
  else if ((cVar1 == 'q') && (iVar2 = strncmp(in_RSI,"quote",(size_t)zName), iVar2 == 0)) {
    *(undefined4 *)(in_RDI + 0x2c) = 6;
    std::__cxx11::string::operator=((string *)(in_RDI + 0x60),",");
    std::__cxx11::string::operator=((string *)(in_RDI + 0x80),anon_var_dwarf_3e83f70 + 8);
  }
  else if ((cVar1 == 'a') && (iVar2 = strncmp(in_RSI,"ascii",(size_t)zName), iVar2 == 0)) {
    *(undefined4 *)(in_RDI + 0x2c) = 10;
    std::__cxx11::string::operator=((string *)(in_RDI + 0x60),"\x1f");
    std::__cxx11::string::operator=((string *)(in_RDI + 0x80),"\x1e");
  }
  else if ((cVar1 == 'm') && (iVar2 = strncmp(in_RSI,"markdown",(size_t)zName), iVar2 == 0)) {
    *(undefined4 *)(in_RDI + 0x2c) = 0xe;
  }
  else if ((cVar1 == 't') && (iVar2 = strncmp(in_RSI,"table",(size_t)zName), iVar2 == 0)) {
    *(undefined4 *)(in_RDI + 0x2c) = 0xf;
  }
  else if ((cVar1 == 'b') && (iVar2 = strncmp(in_RSI,"box",(size_t)zName), iVar2 == 0)) {
    *(undefined4 *)(in_RDI + 0x2c) = 0x10;
  }
  else if ((cVar1 == 'd') && (iVar2 = strncmp(in_RSI,"duckbox",(size_t)zName), iVar2 == 0)) {
    *(undefined4 *)(in_RDI + 0x2c) = 0x14;
  }
  else if ((cVar1 == 'j') && (iVar2 = strncmp(in_RSI,"json",(size_t)zName), iVar2 == 0)) {
    *(undefined4 *)(in_RDI + 0x2c) = 0xd;
  }
  else if ((cVar1 == 'l') && (iVar2 = strncmp(in_RSI,"latex",(size_t)zName), iVar2 == 0)) {
    *(undefined4 *)(in_RDI + 0x2c) = 0x11;
  }
  else if ((cVar1 == 't') && (iVar2 = strncmp(in_RSI,"trash",(size_t)zName), iVar2 == 0)) {
    *(undefined4 *)(in_RDI + 0x2c) = 0x12;
  }
  else {
    if ((cVar1 != 'j') || (iVar2 = strncmp(in_RSI,"jsonlines",(size_t)zName), iVar2 != 0)) {
      fprintf(_stderr,
              "Error: mode should be one of: ascii box column csv duckbox html insert json jsonlines latex line list markdown quote table tabs tcl trash \n"
             );
      return false;
    }
    *(undefined4 *)(in_RDI + 0x2c) = 0x13;
  }
  *(undefined4 *)(in_RDI + 0x34) = *(undefined4 *)(in_RDI + 0x2c);
  return true;
}

Assistant:

bool ShellState::SetOutputMode(const char *mode_str, const char *tbl_name) {
	idx_t n2 = StringLength(mode_str);
	char c2 = mode_str[0];
	if (c2 == 'l' && n2 > 2 && strncmp(mode_str, "lines", n2) == 0) {
		mode = RenderMode::LINE;
		rowSeparator = SEP_Row;
	} else if (c2 == 'c' && strncmp(mode_str, "columns", n2) == 0) {
		mode = RenderMode::COLUMN;
		if ((shellFlgs & SHFLG_HeaderSet) == 0) {
			showHeader = true;
		}
		rowSeparator = SEP_Row;
	} else if (c2 == 'l' && n2 > 2 && strncmp(mode_str, "list", n2) == 0) {
		mode = RenderMode::LIST;
		colSeparator = SEP_Column;
		rowSeparator = SEP_Row;
	} else if (c2 == 'h' && strncmp(mode_str, "html", n2) == 0) {
		mode = RenderMode::HTML;
	} else if (c2 == 't' && strncmp(mode_str, "tcl", n2) == 0) {
		mode = RenderMode::TCL;
		colSeparator = SEP_Space;
		rowSeparator = SEP_Row;
	} else if (c2 == 'c' && strncmp(mode_str, "csv", n2) == 0) {
		mode = RenderMode::CSV;
		colSeparator = SEP_Comma;
		rowSeparator = SEP_CrLf;
	} else if (c2 == 't' && strncmp(mode_str, "tabs", n2) == 0) {
		mode = RenderMode::LIST;
		colSeparator = SEP_Tab;
	} else if (c2 == 'i' && strncmp(mode_str, "insert", n2) == 0) {
		mode = RenderMode::INSERT;
		SetTableName(tbl_name ? tbl_name : "table");
	} else if (c2 == 'q' && strncmp(mode_str, "quote", n2) == 0) {
		mode = RenderMode::QUOTE;
		colSeparator = SEP_Comma;
		rowSeparator = SEP_Row;
	} else if (c2 == 'a' && strncmp(mode_str, "ascii", n2) == 0) {
		mode = RenderMode::ASCII;
		colSeparator = SEP_Unit;
		rowSeparator = SEP_Record;
	} else if (c2 == 'm' && strncmp(mode_str, "markdown", n2) == 0) {
		mode = RenderMode::MARKDOWN;
	} else if (c2 == 't' && strncmp(mode_str, "table", n2) == 0) {
		mode = RenderMode::TABLE;
	} else if (c2 == 'b' && strncmp(mode_str, "box", n2) == 0) {
		mode = RenderMode::BOX;
	} else if (c2 == 'd' && strncmp(mode_str, "duckbox", n2) == 0) {
		mode = RenderMode::DUCKBOX;
	} else if (c2 == 'j' && strncmp(mode_str, "json", n2) == 0) {
		mode = RenderMode::JSON;
	} else if (c2 == 'l' && strncmp(mode_str, "latex", n2) == 0) {
		mode = RenderMode::LATEX;
	} else if (c2 == 't' && strncmp(mode_str, "trash", n2) == 0) {
		mode = RenderMode::TRASH;
	} else if (c2 == 'j' && strncmp(mode_str, "jsonlines", n2) == 0) {
		mode = RenderMode::JSONLINES;
	} else {
		raw_printf(stderr, "Error: mode should be one of: "
		                   "ascii box column csv duckbox html insert json jsonlines latex line "
		                   "list markdown quote table tabs tcl trash \n");
		return false;
	}
	cMode = mode;
	return true;
}